

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# params.cpp
# Opt level: O0

void __thiscall
hedg::params::market_catalogue::market_catalogue
          (market_catalogue *this,string *session_id_,string *start_time_,string *end_time_,
          string *end_point_,string *event_type_ids_,string *market_type_codes_,
          string *market_countries_,string *max_results_,string *market_projection_)

{
  string *event_type_ids__local;
  string *end_point__local;
  string *end_time__local;
  string *start_time__local;
  string *session_id__local;
  market_catalogue *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)session_id_);
  std::__cxx11::string::string((string *)&this->start_time,(string *)start_time_);
  std::__cxx11::string::string((string *)&this->end_time,(string *)end_time_);
  std::__cxx11::string::string((string *)&this->end_point,(string *)end_point_);
  std::__cxx11::string::string((string *)&this->event_type_ids,(string *)event_type_ids_);
  std::__cxx11::string::string((string *)&this->market_type_codes,(string *)market_type_codes_);
  std::__cxx11::string::string((string *)&this->max_results,(string *)max_results_);
  std::__cxx11::string::string((string *)&this->market_projection,(string *)market_projection_);
  std::__cxx11::string::string((string *)&this->market_countries,(string *)market_countries_);
  return;
}

Assistant:

market_catalogue::market_catalogue(std::string session_id_, std::string start_time_, std::string end_time_, std::string end_point_, std::string event_type_ids_,
		std::string market_type_codes_, std::string market_countries_ , std::string max_results_ ,std::string market_projection_)
		:session_id{ session_id_ }, start_time{ start_time_ }, end_time{ end_time_ }, end_point{end_point_}, event_type_ids{ event_type_ids_ },
		market_type_codes{ market_type_codes_ }, market_countries{ market_countries_ }, max_results{ max_results_ },
		market_projection{ market_projection_ } {}